

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.c
# Opt level: O1

void ht_init(HashTable *ht,HTKeyType key_type,uint32_t init_cap,_func_void_HTItem_ptr *free_callback
            )

{
  uint64_t uVar1;
  HTItem **ppHVar2;
  
  uVar1 = next_pow_of_2((ulong)init_cap);
  ht->cap = (uint32_t)uVar1;
  ht->size = 0;
  ht->buckets = (HTItem **)0x0;
  ht->key_type = key_type;
  ht->free_callback = free_callback;
  ppHVar2 = (HTItem **)calloc(uVar1 & 0xffffffff,8);
  ht->buckets = ppHVar2;
  return;
}

Assistant:

void ht_init(HashTable *ht, HTKeyType key_type, uint32_t init_cap, void(*free_callback)(HTItem *)) {
    ht->cap = (uint32_t) next_pow_of_2(init_cap);
    ht->size = 0;
    ht->buckets = NULL;
    ht->key_type = key_type;
    ht->free_callback = free_callback;

    ht->buckets = calloc(ht->cap, sizeof(HTItem *));
}